

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMAttrMapImpl::setNamedItemFast(DOMAttrMapImpl *this,DOMNode *arg)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  undefined4 extraout_var;
  DOMException *this_00;
  
  if (arg == (DOMNode *)0x0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)__dynamic_cast(arg,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar3 != (long *)0x0) {
    lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3);
    if (lVar4 != 0) {
      lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3);
      *(DOMNode **)(lVar4 + 8) = this->fOwnerNode;
      *(ushort *)(lVar4 + 0x10) = *(ushort *)(lVar4 + 0x10) | 8;
      iVar1 = (*arg->_vptr_DOMNode[2])(arg);
      uVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])
                        (this,CONCAT44(extraout_var,iVar1));
      if (-1 < (int)uVar2) {
        DOMNodeVector::setElementAt(this->fNodes,arg,(ulong)uVar2);
        return;
      }
      DOMNodeVector::insertElementAt(this->fNodes,arg,(ulong)~uVar2);
      return;
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMAttrMapImpl::setNamedItemFast(DOMNode *arg)
{
    DOMNodeImpl *argImpl = castToNodeImpl(arg);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);
    int i = findNamePoint(arg->getNodeName());

    if(i >= 0)
      fNodes->setElementAt(arg, i);
    else
    {
      i= -1 -i;
      fNodes->insertElementAt(arg, i);
    }
}